

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int find_column(ParseData *lParse,char *colName,void *itslval)

{
  int iVar1;
  int iVar2;
  PixelFilter *pPVar3;
  uint uVar4;
  ulong uVar5;
  fitsfile *infptr;
  ulong uVar6;
  DataInfo *pDVar7;
  long lVar8;
  int colnum;
  int status;
  int typecode;
  int istatus;
  double tscale;
  double tzero;
  long repeat;
  long width;
  char temp [80];
  uint local_d0;
  int local_cc;
  iteratorCol *local_c8;
  int local_c0 [2];
  DataInfo *local_b8;
  double local_b0;
  double local_a8;
  long local_a0;
  long *local_98;
  long local_90;
  char local_88 [88];
  
  if (DEBUG_PIXFILTER != 0) {
    printf("find_column(%s)\n");
  }
  if (*colName == '#') {
    iVar1 = find_keywd(lParse,colName + 1,itslval);
    return iVar1;
  }
  infptr = lParse->def_fptr;
  local_cc = 0;
  iVar1 = lParse->nCols;
  lVar8 = (long)iVar1;
  if (lParse->hdutype == 0) {
    pPVar3 = lParse->pixFilter;
    if (pPVar3 == (PixelFilter *)0x0) {
      lParse->status = 0xdb;
      ffpmsg("find_column: IMAGE_HDU but no PixelFilter");
      return -1;
    }
    local_d0 = 0xffffffff;
    if (pPVar3->count < 1) {
LAB_0011cf27:
      snprintf(local_88,0x50,"find_column: PixelFilter tag %s not found",colName);
      ffpmsg(local_88);
      lParse->status = 0xdb;
      return -1;
    }
    uVar5 = 0xffffffff;
    uVar6 = 0;
    do {
      iVar2 = fits_strcasecmp(colName,pPVar3->tag[uVar6]);
      if (iVar2 == 0) {
        local_d0 = (uint)uVar6;
        uVar5 = uVar6 & 0xffffffff;
      }
      uVar6 = uVar6 + 1;
      pPVar3 = lParse->pixFilter;
    } while ((long)uVar6 < (long)pPVar3->count);
    if ((int)uVar5 < 0) goto LAB_0011cf27;
    iVar1 = fits_parser_allocateCol(lParse,iVar1,&lParse->status);
    if (iVar1 != 0) {
      return -1;
    }
    pDVar7 = lParse->varData;
    local_b8 = pDVar7 + lVar8;
    local_c8 = lParse->colData + lVar8;
    infptr = lParse->pixFilter->ifptr[uVar5];
    local_98 = pDVar7[lVar8].naxes;
    ffgipr(infptr,5,local_c0,&pDVar7[lVar8].naxis,local_98,&local_cc);
    local_98[-2] = 1;
    iVar1 = set_image_col_types(lParse,infptr,colName,local_c0[0],local_b8,local_c8);
    if (iVar1 != 0) {
      return -1;
    }
    local_c8->fptr = infptr;
    local_c8->iotype = 0;
    pDVar7 = local_b8;
  }
  else {
    if (lParse->compressed == 0) {
      iVar2 = ffgcno(infptr,0,colName,(int *)&local_d0,&local_cc);
      if (iVar2 != 0) {
        if (local_cc == 0xdb) {
          iVar1 = find_keywd(lParse,colName,itslval);
          if (iVar1 == -1) {
            return -1;
          }
          ffcmsg();
          return iVar1;
        }
        goto LAB_0011ccda;
      }
    }
    else {
      local_d0 = lParse->valCol;
    }
    iVar2 = ffgtcl(infptr,local_d0,local_c0,&local_a0,&local_90,&local_cc);
    if (iVar2 != 0) goto LAB_0011ccda;
    iVar1 = fits_parser_allocateCol(lParse,iVar1,&lParse->status);
    if (iVar1 != 0) {
      return -1;
    }
    pDVar7 = lParse->varData;
    local_c8 = lParse->colData + lVar8;
    fits_iter_set_by_num(local_c8,infptr,local_d0,0,0);
    pDVar7 = pDVar7 + lVar8;
  }
  strncpy(pDVar7->name,colName,0x50);
  pDVar7->name[0x50] = '\0';
  iVar1 = lParse->hdutype;
  if (iVar1 == 0) {
    iVar2 = 0x10e;
    goto LAB_0011d1e1;
  }
  if (local_c0[0] < 0x10) {
    if (local_c0[0] == 1) {
      pDVar7->type = 0x106;
      local_c8->datatype = 0xb;
      iVar2 = 0x111;
    }
    else {
      if (local_c0[0] == 0xb) {
LAB_0011cfe6:
        snprintf(local_88,0x50,"TZERO%d",(ulong)local_d0);
        local_c0[1] = 0;
        iVar1 = ffgky(infptr,0x52,local_88,&local_a8,(char *)0x0,local_c0 + 1);
        if (iVar1 != 0) {
          local_a8 = 0.0;
        }
        snprintf(local_88,0x50,"TSCAL%d",(ulong)local_d0);
        local_c0[1] = 0;
        iVar1 = ffgky(infptr,0x52,local_88,&local_b0,(char *)0x0,local_c0 + 1);
        if (iVar1 == 0) {
          if ((local_b0 == 1.0) && (!NAN(local_b0))) goto LAB_0011d141;
        }
        else {
          local_b0 = 1.0;
LAB_0011d141:
          if (((local_a8 == 0.0) && (!NAN(local_a8))) || ((local_a8 == 32768.0 && (!NAN(local_a8))))
             ) {
            pDVar7->type = 0x103;
            local_c8->datatype = 0x29;
            goto LAB_0011d180;
          }
        }
        pDVar7->type = 0x104;
        local_c8->datatype = 0x52;
        goto LAB_0011d180;
      }
      if (local_c0[0] != 0xe) goto LAB_0011d1ec;
      pDVar7->type = 0x102;
      local_c8->datatype = 0xe;
      iVar2 = 0x10f;
    }
  }
  else {
    uVar4 = local_c0[0] - 0x15;
    if (uVar4 < 0x3e) {
      if ((0x3000000000200000U >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
        pDVar7->type = 0x104;
        local_c8->datatype = 0x52;
LAB_0011d180:
        iVar2 = 0x10e;
        goto LAB_0011d186;
      }
      if ((0x100001UL >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_0011cfe6;
    }
    if (local_c0[0] != 0x10) {
LAB_0011d1ec:
      if (local_c0[0] < 0) {
        snprintf(local_88,0x50,"variable-length array columns are not supported. typecode = %d");
        ffpmsg(local_88);
      }
      lParse->status = 0x1b0;
      return -1;
    }
    pDVar7->type = 0x105;
    local_c8->datatype = 0x10;
    if (0xff < local_90) {
      snprintf(local_88,0x50,"column %d is wider than maximum %d characters",(ulong)local_d0,0xff);
      ffpmsg(local_88);
      lParse->status = 0x1b1;
      return -1;
    }
    iVar2 = 0x110;
    if (iVar1 == 1) {
      local_a0 = local_90;
    }
  }
LAB_0011d186:
  pDVar7->nelem = local_a0;
  local_c8->repeat = 0;
  if ((local_a0 < 2) || (local_c0[0] == 0x10)) {
    pDVar7->naxis = 1;
    pDVar7->naxes[0] = 1;
  }
  else {
    iVar1 = ffgtdm(infptr,local_d0,5,&pDVar7->naxis,pDVar7->naxes,&local_cc);
    if (iVar1 != 0) {
LAB_0011ccda:
      lParse->status = local_cc;
      return -1;
    }
  }
LAB_0011d1e1:
  lParse->nCols = lParse->nCols + 1;
  *(long *)itslval = lVar8;
  return iVar2;
}

Assistant:

static int find_column( ParseData *lParse, char *colName, void *itslval )
{
   FITS_PARSER_YYSTYPE *thelval = (FITS_PARSER_YYSTYPE*)itslval;
   int col_cnt, status;
   int colnum, typecode, type;
   long repeat, width;
   fitsfile *fptr;
   char temp[80];
   double tzero,tscale;
   int istatus;
   DataInfo *varInfo;
   iteratorCol *colIter;

if (DEBUG_PIXFILTER)
   printf("find_column(%s)\n", colName);

   if( *colName == '#' )
     return( find_keywd( lParse, colName + 1, itslval ) );

   fptr = lParse->def_fptr;

   status = 0;
   col_cnt = lParse->nCols;

if (lParse->hdutype == IMAGE_HDU) {
   int i;
   if (!lParse->pixFilter) {
      lParse->status = COL_NOT_FOUND;
      ffpmsg("find_column: IMAGE_HDU but no PixelFilter");
      return pERROR;
   }

   colnum = -1;
   for (i = 0; i < lParse->pixFilter->count; ++i) {
      if (!fits_strcasecmp(colName, lParse->pixFilter->tag[i]))
         colnum = i;
   }
   if (colnum < 0) {
      snprintf(temp, 80, "find_column: PixelFilter tag %s not found", colName);
      ffpmsg(temp);
      lParse->status = COL_NOT_FOUND;
      return pERROR;
   }

   if( fits_parser_allocateCol( lParse, col_cnt, &lParse->status ) ) return pERROR;

   varInfo = lParse->varData + col_cnt;
   colIter = lParse->colData + col_cnt;

   fptr = lParse->pixFilter->ifptr[colnum];
   fits_get_img_param(fptr,
                MAXDIMS,
                &typecode, /* actually bitpix */
                &varInfo->naxis,
                &varInfo->naxes[0],
                &status);
   varInfo->nelem = 1;
   type = COLUMN;
   if (set_image_col_types(lParse, fptr, colName, typecode, varInfo, colIter))
      return pERROR;
   colIter->fptr = fptr;
   colIter->iotype = InputCol;
}
else { /* HDU holds a table */
   if( lParse->compressed )
      colnum = lParse->valCol;
   else
      if( fits_get_colnum( fptr, CASEINSEN, colName, &colnum, &status ) ) {
         if( status == COL_NOT_FOUND ) {
	   type = find_keywd( lParse, colName, itslval );
            if( type != pERROR ) ffcmsg();
            return( type );
         }
         lParse->status = status;
         return pERROR;
      }
   
   if( fits_get_coltype( fptr, colnum, &typecode,
                         &repeat, &width, &status ) ) {
      lParse->status = status;
      return pERROR;
   }

   if( fits_parser_allocateCol( lParse, col_cnt, &lParse->status ) ) return pERROR;

   varInfo = lParse->varData + col_cnt;
   colIter = lParse->colData + col_cnt;

   fits_iter_set_by_num( colIter, fptr, colnum, 0, InputCol );
}

   /*  Make sure we don't overflow variable name array  */
   strncpy(varInfo->name,colName,MAXVARNAME);
   varInfo->name[MAXVARNAME] = '\0';

if (lParse->hdutype != IMAGE_HDU) {
   switch( typecode ) {
   case TBIT:
      varInfo->type     = BITSTR;
      colIter->datatype = TBYTE;
      type = BITCOL;
      break;
   case TBYTE:
   case TSHORT:
   case TLONG:
      /* The datatype of column with TZERO and TSCALE keywords might be 
         float or double. 
      */
      snprintf(temp,80,"TZERO%d",colnum);
      istatus = 0;
      if(fits_read_key(fptr,TDOUBLE,temp,&tzero,NULL,&istatus)) {
          tzero = 0.0;
      } 
      snprintf(temp,80,"TSCAL%d",colnum);
      istatus = 0;
      if(fits_read_key(fptr,TDOUBLE,temp,&tscale,NULL,&istatus)) {
          tscale = 1.0;
      } 
      if (tscale == 1.0 && (tzero == 0.0 || tzero == 32768.0 )) {
          varInfo->type     = LONG;
          colIter->datatype = TLONG;
/*    Reading an unsigned long column as a long can cause overflow errors.
      Treat the column as a double instead.
      } else if (tscale == 1.0 &&  tzero == 2147483648.0 ) {
          varInfo->type     = LONG;
          colIter->datatype = TULONG;
 */

      }
      else {
          varInfo->type     = DOUBLE;
          colIter->datatype = TDOUBLE;
      }
      type = COLUMN;
      break;
/* 
  For now, treat 8-byte integer columns as type double.
  This can lose precision, so the better long term solution
  will be to add support for TLONGLONG as a separate datatype.
*/
   case TLONGLONG:
   case TFLOAT:
   case TDOUBLE:
      varInfo->type     = DOUBLE;
      colIter->datatype = TDOUBLE;
      type = COLUMN;
      break;
   case TLOGICAL:
      varInfo->type     = BOOLEAN;
      colIter->datatype = TLOGICAL;
      type = BCOLUMN;
      break;
   case TSTRING:
      varInfo->type     = STRING;
      colIter->datatype = TSTRING;
      type = SCOLUMN;
      if ( width >= MAX_STRLEN ) {
	snprintf(temp, 80, "column %d is wider than maximum %d characters",
		colnum, MAX_STRLEN-1);
        ffpmsg(temp);
	lParse->status = PARSE_LRG_VECTOR;
	return pERROR;
      }
      if( lParse->hdutype == ASCII_TBL ) repeat = width;
      break;
   default:
      if (typecode < 0) {
        snprintf(temp, 80,"variable-length array columns are not supported. typecode = %d", typecode);
        ffpmsg(temp);
      }
      lParse->status = PARSE_BAD_TYPE;
      return pERROR;
   }
   varInfo->nelem = repeat;
   colIter->repeat = 0; /* ffiter() will fill in this value */
   if( repeat>1 && typecode!=TSTRING ) {
      if( fits_read_tdim( fptr, colnum, MAXDIMS,
                          &varInfo->naxis,
                          &varInfo->naxes[0], &status )
          ) {
         lParse->status = status;
         return pERROR;
      }
   } else {
      varInfo->naxis = 1;
      varInfo->naxes[0] = 1;
   }
}
   lParse->nCols++;
   thelval->lng = col_cnt;

   return( type );
}